

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MNetwork.hpp
# Opt level: O2

void __thiscall
Atari2600::Cartridge::MNetwork::perform_bus_operation
          (MNetwork *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  long lStack_8;
  
  uVar4 = (uint)address;
  uVar3 = uVar4 & 0x1fff;
  uVar2 = (ushort)uVar3;
  if (uVar2 < 0x1000) {
    return;
  }
  if ((ushort)(uVar2 + 0xe020) < 7) {
    puVar5 = (this->super_BusExtender).rom_base_ + ((ulong)(uVar3 << 0xb) - 0xff0000);
    lStack_8 = 0x10;
LAB_002bc2f6:
    *(uint8_t **)((long)this->rom_ptr_ + lStack_8 + -0x10) = puVar5;
LAB_002bc2fc:
    if ((uVar3 >> 0xb & 1) == 0) {
      puVar5 = this->rom_ptr_[0];
      if (puVar5 == (uint8_t *)0x0) {
        if (uVar2 < 0x1400) {
          this->low_ram_[uVar4 & 0x3ff] = *value;
          return;
        }
        if (4 < (int)operation) {
          return;
        }
        uVar1 = this->low_ram_[uVar4 & 0x3ff];
        goto LAB_002bc386;
      }
      if (4 < (int)operation) {
        return;
      }
      goto LAB_002bc37e;
    }
    if (uVar2 < 0x1900) {
      this->high_ram_ptr_[uVar4 & 0xff] = *value;
      return;
    }
    if (0x19ff < uVar2) goto LAB_002bc371;
    if (4 < (int)operation) {
      return;
    }
    puVar5 = this->high_ram_ptr_;
    uVar4 = uVar4 & 0xff;
  }
  else {
    if (uVar3 != 0x1fe7) {
      if ((address & 0x1ffc) == 0x1ff8) {
        puVar5 = this->high_ram_ + (uVar3 * 0x100 - 0x1ff800);
        lStack_8 = 0x20;
        goto LAB_002bc2f6;
      }
      goto LAB_002bc2fc;
    }
    this->rom_ptr_[0] = (uint8_t *)0x0;
LAB_002bc371:
    if (4 < (int)operation) {
      return;
    }
    puVar5 = this->rom_ptr_[1];
LAB_002bc37e:
    uVar4 = uVar4 & 0x7ff;
  }
  uVar1 = puVar5[uVar4];
LAB_002bc386:
  *value = uVar1;
  return;
}

Assistant:

void perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			address &= 0x1fff;
			if(!(address & 0x1000)) return;

			if(address >= 0x1fe0 && address <= 0x1fe6) {
				rom_ptr_[0] = rom_base_ + (address - 0x1fe0) * 2048;
			} else if(address == 0x1fe7) {
				rom_ptr_[0] = nullptr;
			} else if(address >= 0x1ff8 && address <= 0x1ffb) {
				int offset = (address - 0x1ff8) * 256;
				high_ram_ptr_ = &high_ram_[offset];
			}

			if(address & 0x800) {
				if(address < 0x1900) {
					high_ram_ptr_[address & 255] = *value;
				} else if(address < 0x1a00) {
					if(isReadOperation(operation)) *value = high_ram_ptr_[address & 255];
				} else {
					if(isReadOperation(operation)) *value = rom_ptr_[1][address & 2047];
				}
			} else {
				if(rom_ptr_[0]) {
					if(isReadOperation(operation)) *value = rom_ptr_[0][address & 2047];
				} else {
					if(address < 0x1400) {
						low_ram_[address & 1023] = *value;
					} else {
						if(isReadOperation(operation)) *value = low_ram_[address & 1023];
					}
				}
			}
		}